

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  bool bVar1;
  Result RVar2;
  ulong uVar3;
  char *pcVar4;
  Enum EVar5;
  Enum EVar6;
  uint8_t mutable_;
  Type field_type;
  bool local_29;
  Type local_28;
  
  RVar2 = ReadType(this,&local_28,"field type");
  EVar5 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = IsConcreteType((BinaryReader *)this->options_,local_28);
    if (bVar1) {
      local_29 = false;
      RVar2 = ReadU8(this,&local_29,"field mutability");
      EVar5 = Error;
      if (RVar2.enum_ != Error) {
        if (local_29 < true) {
          out_value->type = local_28;
          out_value->mutable_ = local_29;
          EVar5 = Ok;
        }
        else {
          PrintError(this,"field mutability must be 0 or 1");
        }
      }
    }
    else {
      EVar6 = local_28.enum_;
      pcVar4 = "";
      if (EVar6 < Any) {
        pcVar4 = "-";
      }
      uVar3 = (ulong)(uint)-EVar6;
      if (Any < EVar6) {
        uVar3 = (ulong)local_28 & 0xffffffff;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar4,uVar3);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}